

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int insertCell(MemPage *pPage,int i,u8 *pCell,int sz,u8 *pTemp,Pgno iChild)

{
  uint uVar1;
  byte bVar2;
  u8 *puVar3;
  u8 uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  u8 *puVar8;
  undefined8 uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  int rc2;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pPage->nOverflow == '\0') && (uVar1 = sz + 2, (int)uVar1 <= pPage->nFree)) {
    iVar6 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar6 != 0) goto LAB_0015891b;
    puVar3 = pPage->aData;
    uVar12 = (ulong)pPage->hdrOffset;
    local_3c = 0;
    uVar13 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
    uVar5 = *(ushort *)(puVar3 + uVar12 + 5) << 8 | *(ushort *)(puVar3 + uVar12 + 5) >> 8;
    uVar11 = (uint)uVar5;
    if (uVar5 < uVar13) {
      uVar9 = 0x11bb1;
      if ((uVar11 == 0) && (uVar11 = 0x10000, pPage->pBt->usableSize == 0x10000)) {
LAB_001589d7:
        if (((puVar3[uVar12 + 2] == '\0') && (puVar3[uVar12 + 1] == '\0')) || (uVar11 < uVar13 + 2))
        {
LAB_00158a60:
          if ((int)uVar11 < (int)(uVar13 + uVar1)) {
            iVar7 = pPage->nFree - uVar1;
            iVar6 = 4;
            if (iVar7 < 4) {
              iVar6 = iVar7;
            }
            iVar6 = defragmentPage(pPage,iVar6);
            if (iVar6 != 0) goto LAB_0015891b;
            uVar11 = (((uint)puVar3[uVar12 + 5] * 0x100 + (uint)puVar3[uVar12 + 6]) - 1 & 0xffff) +
                     1;
          }
          iVar6 = uVar11 - sz;
          uVar4 = (u8)((uint)iVar6 >> 8);
          *(ushort *)(puVar3 + uVar12 + 5) = (ushort)iVar6 << 8 | (ushort)iVar6 >> 8;
        }
        else {
          puVar8 = pageFindSlot(pPage,sz,&local_3c);
          if (puVar8 == (u8 *)0x0) {
            iVar6 = local_3c;
            if (local_3c != 0) goto LAB_0015891b;
            goto LAB_00158a60;
          }
          iVar6 = (int)((long)puVar8 - (long)puVar3);
          if (iVar6 <= (int)uVar13) {
            uVar9 = 0x11bc5;
            goto LAB_001589bd;
          }
          uVar4 = (u8)((ulong)((long)puVar8 - (long)puVar3) >> 8);
        }
        pPage->nFree = pPage->nFree - (uVar1 & 0xffff);
        memcpy((uint *)((long)(puVar3 + iVar6) + 4),pCell + 4,(long)(sz + -4));
        *(Pgno *)(puVar3 + iVar6) =
             iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
        lVar10 = (long)i;
        puVar8 = pPage->aCellIdx + lVar10 * 2;
        memmove(puVar8 + 2,pPage->aCellIdx + lVar10 * 2,((ulong)pPage->nCell - lVar10) * 2);
        *puVar8 = uVar4;
        puVar8[1] = (u8)iVar6;
        pPage->nCell = pPage->nCell + 1;
        puVar8 = puVar3 + (ulong)pPage->hdrOffset + 4;
        *puVar8 = *puVar8 + '\x01';
        if (*puVar8 == '\0') {
          puVar3[(ulong)pPage->hdrOffset + 3] = puVar3[(ulong)pPage->hdrOffset + 3] + '\x01';
        }
        if (pPage->pBt->autoVacuum != '\0') {
          local_3c = 0;
          ptrmapPutOvflPtr(pPage,pPage,pCell,&local_3c);
          iVar6 = local_3c;
          if (local_3c != 0) goto LAB_0015891b;
        }
        goto LAB_00158918;
      }
    }
    else {
      uVar9 = 0x11bb4;
      if ((int)uVar11 <= (int)pPage->pBt->usableSize) goto LAB_001589d7;
    }
LAB_001589bd:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    iVar6 = 0xb;
  }
  else {
    if (pTemp != (u8 *)0x0) {
      memcpy(pTemp,pCell,(long)sz);
      pCell = pTemp;
    }
    *(Pgno *)pCell =
         iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = pCell;
    pPage->aiOvfl[bVar2] = (u16)i;
LAB_00158918:
    iVar6 = 0;
  }
LAB_0015891b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int insertCell(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz,           /* Bytes of content in pCell */
  u8 *pTemp,        /* Temp storage space for pCell, if needed */
  Pgno iChild       /* If non-zero, replace first 4 bytes with this value */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sz==pPage->xCellSize(pPage, pCell) || CORRUPT_DB );
  assert( pPage->nFree>=0 );
  assert( iChild>0 );
  if( pPage->nOverflow || sz+2>pPage->nFree ){
    if( pTemp ){
      memcpy(pTemp, pCell, sz);
      pCell = pTemp;
    }
    put4byte(pCell, iChild);
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( NEVER(rc!=SQLITE_OK) ){
      return rc;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ return rc; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    /* In a corrupt database where an entry in the cell index section of
    ** a btree page has a value of 3 or less, the pCell value might point
    ** as many as 4 bytes in front of the start of the aData buffer for
    ** the source page.  Make sure this does not cause problems by not
    ** reading the first 4 bytes */
    memcpy(&data[idx+4], pCell+4, sz-4);
    put4byte(&data[idx], iChild);
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell || CORRUPT_DB );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      int rc2 = SQLITE_OK;
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pPage, pCell, &rc2);
      if( rc2 ) return rc2;
    }
#endif
  }
  return SQLITE_OK;
}